

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<false>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,VWReaderHandler<false> *handler,
          bool isKey)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  SizeType len;
  size_t escapeOffset;
  byte *str;
  StreamLocalCopy<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>_>,_1> copy;
  GenericInsituStringStream<rapidjson::UTF8<char>_> local_58;
  GenericInsituStringStream<rapidjson::UTF8<char>_> *local_40;
  ulong local_38;
  
  local_58.head_ = is->head_;
  str = (byte *)(is->src_ + 1);
  local_58.src_ = (Ch *)str;
  local_58.dst_ = (Ch *)str;
  local_40 = is;
  do {
    while (bVar2 = *local_58.src_, bVar2 == 0x5c) {
      escapeOffset = (long)local_58.src_ - (long)local_58.head_;
      pbVar1 = (byte *)(local_58.src_ + 1);
      if (ParseStringToStream<1u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>&,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>&)
          ::escape[*pbVar1] == 0) {
        if (*pbVar1 != 0x75) {
          *(undefined4 *)(this + 0x30) = 10;
          local_58.src_ = local_58.src_ + 1;
LAB_001ba587:
          *(size_t *)(this + 0x38) = escapeOffset;
          goto LAB_001ba55c;
        }
        local_58.src_ = local_58.src_ + 2;
        uVar4 = ParseHex4<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                          ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                            *)this,&local_58,escapeOffset);
        if (*(int *)(this + 0x30) != 0) goto LAB_001ba55c;
        if ((uVar4 & 0xfffffc00) == 0xd800) {
          pbVar1 = (byte *)local_58.src_;
          if ((*local_58.src_ == 0x5c) &&
             (pbVar1 = (byte *)(local_58.src_ + 1), local_58.src_[1] == 0x75)) {
            local_58.src_ = local_58.src_ + 2;
            local_38 = (ulong)uVar4;
            uVar4 = ParseHex4<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                              ((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                *)this,&local_58,escapeOffset);
            if (*(int *)(this + 0x30) != 0) goto LAB_001ba55c;
            pbVar1 = (byte *)local_58.src_;
            if (0xfffffbff < uVar4 - 0xe000) {
              uVar4 = (int)local_38 * 0x400 + uVar4 + 0xfca02400;
              goto LAB_001ba465;
            }
          }
          local_58.src_ = (Ch *)pbVar1;
          *(undefined4 *)(this + 0x30) = 9;
          goto LAB_001ba587;
        }
LAB_001ba465:
        UTF8<char>::Encode<rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>
                  (&local_58,uVar4);
      }
      else {
        local_58.src_ = local_58.src_ + 2;
        *local_58.dst_ =
             ParseStringToStream<1u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>>(rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>&,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>&)
             ::escape[*pbVar1];
        local_58.dst_ = local_58.dst_ + 1;
      }
    }
    if (bVar2 == 0x22) {
      local_58.src_ = local_58.src_ + 1;
      pbVar1 = (byte *)(local_58.dst_ + 1);
      *local_58.dst_ = 0;
      local_58.dst_ = (Ch *)pbVar1;
      if (*(int *)(this + 0x30) != 0) goto LAB_001ba55c;
      local_58.dst_._0_4_ = (int)pbVar1;
      len = ~(uint)str + (int)local_58.dst_;
      if (isKey) {
        bVar3 = VWReaderHandler<false>::Key(handler,(char *)str,len,false);
      }
      else {
        bVar3 = VWReaderHandler<false>::String(handler,(char *)str,len,false);
      }
      if (bVar3 != false) goto LAB_001ba55c;
      lVar5 = (long)local_58.src_ - (long)local_58.head_;
      *(undefined4 *)(this + 0x30) = 0x10;
      goto LAB_001ba558;
    }
    if (bVar2 < 0x20) {
      lVar5 = (long)local_58.src_ - (long)local_58.head_;
      if (bVar2 == 0) {
        *(undefined4 *)(this + 0x30) = 0xb;
      }
      else {
        *(undefined4 *)(this + 0x30) = 10;
      }
LAB_001ba558:
      *(long *)(this + 0x38) = lVar5;
LAB_001ba55c:
      local_40->head_ = local_58.head_;
      local_40->src_ = local_58.src_;
      local_40->dst_ = local_58.dst_;
      return;
    }
    *local_58.dst_ = *local_58.src_;
    local_58.src_ = local_58.src_ + 1;
    local_58.dst_ = local_58.dst_ + 1;
  } while( true );
}

Assistant:

void ParseString(InputStream& is, Handler& handler, bool isKey = false) {
        internal::StreamLocalCopy<InputStream> copy(is);
        InputStream& s(copy.s);

        RAPIDJSON_ASSERT(s.Peek() == '\"');
        s.Take();  // Skip '\"'

        bool success = false;
        if (parseFlags & kParseInsituFlag) {
            typename InputStream::Ch *head = s.PutBegin();
            ParseStringToStream<parseFlags, SourceEncoding, SourceEncoding>(s, s);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            size_t length = s.PutEnd(head) - 1;
            RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
            const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
            success = (isKey ? handler.Key(str, SizeType(length), false) : handler.String(str, SizeType(length), false));
        }
        else {
            StackStream<typename TargetEncoding::Ch> stackStream(stack_);
            ParseStringToStream<parseFlags, SourceEncoding, TargetEncoding>(s, stackStream);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            SizeType length = static_cast<SizeType>(stackStream.Length()) - 1;
            const typename TargetEncoding::Ch* const str = stackStream.Pop();
            success = (isKey ? handler.Key(str, length, true) : handler.String(str, length, true));
        }
        if (RAPIDJSON_UNLIKELY(!success))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, s.Tell());
    }